

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_double_test.cpp
# Opt level: O1

void __thiscall
reflect_value_cast_double_test_double_to_double_cast_Test::TestBody
          (reflect_value_cast_double_test_double_to_double_cast_Test *this)

{
  undefined8 uVar1;
  char *message;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  internal local_28 [8];
  undefined8 *local_20;
  
  uVar1 = value_create_double(0x405393ff2e48e8a7);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             value_to_double(uVar1);
  uVar1 = value_type_cast(uVar1,6);
  local_40._M_head_impl = local_30;
  local_38.data_ = (AssertHelperData *)value_to_double(uVar1);
  testing::internal::CmpHelperEQ<double,double>
            (local_28,"(double)d","(double)value_to_double(v)",(double *)&local_40,
             (double *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_double_test.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  value_destroy(uVar1);
  return;
}

Assistant:

TEST_F(reflect_value_cast_double_test, double_to_double_cast)
{
	value v = value_create_double(78.31245);

	double d = value_to_double(v);

	v = value_type_cast(v, TYPE_DOUBLE);

	EXPECT_EQ((double)d, (double)value_to_double(v));

	value_destroy(v);
}